

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O3

int FsPutFileW(WCHAR *LocalName,WCHAR *RemoteName,int CopyFlags)

{
  WCHAR *pWVar1;
  int iVar2;
  WCHAR *pWVar3;
  WCHAR *pWVar4;
  long lVar5;
  int iVar6;
  wcharstring wRemoteName;
  wcharstring wLocalName;
  ifstream ifs;
  WCHAR *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  WCHAR *local_298 [2];
  long local_288 [2];
  string local_278;
  string local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  iVar6 = 6;
  if ((CopyFlags & 2U) == 0) {
    std::ifstream::ifstream(local_238);
    if (RemoteName == (WCHAR *)0x0) {
      pWVar4 = (WCHAR *)0x2;
    }
    else {
      pWVar3 = RemoteName + -1;
      do {
        pWVar4 = pWVar3 + 1;
        pWVar1 = pWVar3 + 1;
        pWVar3 = pWVar4;
      } while (*pWVar1 != 0);
    }
    local_2b8 = (WCHAR *)local_2a8;
    std::__cxx11::
    basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>::
    _M_construct<unsigned_short_const*>
              ((basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>
                *)&local_2b8,RemoteName,pWVar4);
    local_298[0] = (WCHAR *)local_288;
    if (LocalName == (WCHAR *)0x0) {
      pWVar4 = (WCHAR *)0x2;
    }
    else {
      pWVar3 = LocalName + -1;
      do {
        pWVar4 = pWVar3 + 1;
        pWVar1 = pWVar3 + 1;
        pWVar3 = pWVar4;
      } while (*pWVar1 != 0);
    }
    std::__cxx11::
    basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>::
    _M_construct<unsigned_short_const*>
              ((basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>
                *)local_298,LocalName,pWVar4);
    if (local_2b0 != 0) {
      lVar5 = 0;
      do {
        if (*(short *)((long)local_2b8 + lVar5) == 0x5c) {
          *(undefined2 *)((long)local_2b8 + lVar5) = 0x2f;
        }
        lVar5 = lVar5 + 2;
      } while (local_2b0 * 2 != lVar5);
    }
    toUTF8_abi_cxx11_(&local_278,local_298[0]);
    std::ifstream::open((string *)local_238,(_Ios_Openmode)&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    iVar6 = 3;
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
      iVar2 = (*gProgressProcW)(gPluginNumber,LocalName,RemoteName,0);
      iVar6 = 5;
      if (iVar2 == 0) {
        toUTF8_abi_cxx11_(&local_258,local_2b8);
        YdiskRestClient::uploadFile(&rest_client,&local_258,(ifstream *)local_238,CopyFlags & 1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        (*gProgressProcW)(gPluginNumber,LocalName,RemoteName,100);
        std::ifstream::close();
        iVar6 = 0;
        if ((CopyFlags & 4U) != 0) {
          toUTF8_abi_cxx11_(&local_278,LocalName);
          remove(local_278._M_dataplus._M_p);
          iVar6 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    if (local_298[0] != (WCHAR *)local_288) {
      operator_delete(local_298[0],local_288[0] * 2 + 2);
    }
    if (local_2b8 != (WCHAR *)local_2a8) {
      operator_delete(local_2b8,local_2a8[0] * 2 + 2);
    }
    std::ifstream::~ifstream(local_238);
  }
  return iVar6;
}

Assistant:

int DCPCALL FsPutFileW(WCHAR* LocalName,WCHAR* RemoteName,int CopyFlags) {
    if (CopyFlags & FS_COPYFLAGS_RESUME)
        return FS_FILE_NOTSUPPORTED;

    try {
        std::ifstream ifs;
        wcharstring wRemoteName(RemoteName), wLocalName(LocalName);
        std::replace(wRemoteName.begin(), wRemoteName.end(), u'\\', u'/');
        ifs.open(toUTF8(wLocalName.data()), std::ios::binary | std::ofstream::in);
        if (!ifs || ifs.bad())
            return FS_FILE_READERROR;

        int err = gProgressProcW(gPluginNumber, LocalName, RemoteName, 0);
        if (err)
            return FS_FILE_USERABORT;
        rest_client.uploadFile(toUTF8(wRemoteName.data()), ifs, (CopyFlags & FS_COPYFLAGS_OVERWRITE));
        gProgressProcW(gPluginNumber, LocalName, RemoteName, 100);

        ifs.close();

        if(CopyFlags & FS_COPYFLAGS_MOVE)
            std::remove(toUTF8(LocalName).c_str());

    } catch(rest_client_exception & e){
        if(e.get_status() == 409){
            return FS_FILE_EXISTS;
        } else {
            gRequestProcW(gPluginNumber, RT_MsgOK, (WCHAR*)u"Error", (WCHAR*) fromUTF8(e.what()).c_str(), NULL, 0);
            return FS_FILE_WRITEERROR;
        }
    } catch (std::runtime_error & e){
        gRequestProcW(gPluginNumber, RT_MsgOK, (WCHAR*)u"Error", (WCHAR*) fromUTF8(e.what()).c_str(), NULL, 0);
        return FS_FILE_WRITEERROR;
    }

    return FS_FILE_OK;
}